

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O2

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::Node>::~PointerArray(PointerArray<COLLADAFW::Node> *this)

{
  ~PointerArray(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~PointerArray()
		{
			deleteContents();
		}